

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall
OpenMD::SelectionCompiler::lookingAtInteger(SelectionCompiler *this,bool allowNegative)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  int iVar6;
  long lVar7;
  allocator<char> local_49;
  string local_48;
  char *local_28 [4];
  
  iVar1 = this->ichToken;
  iVar2 = this->cchScript;
  if (iVar1 != iVar2) {
    if (allowNegative) {
      pcVar5 = (this->script)._M_dataplus._M_p;
      iVar4 = (uint)(pcVar5[iVar1] == '-') + iVar1;
    }
    else {
      pcVar5 = (this->script)._M_dataplus._M_p;
      iVar4 = iVar1;
    }
    lVar7 = (long)iVar4;
    iVar6 = iVar2;
    if (iVar2 < iVar4) {
      iVar6 = iVar4;
    }
    for (; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      if (9 < (int)pcVar5[lVar7] - 0x30U) {
        iVar6 = (int)lVar7;
        break;
      }
    }
    if (iVar4 != iVar6) {
      this->cchToken = iVar6 - iVar1;
      std::__cxx11::string::substr((ulong)local_28,(ulong)&this->script);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,local_28[0],&local_49);
      bVar3 = isInteger(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)local_28);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtInteger(bool allowNegative) {
    if (ichToken == cchScript) { return false; }
    int ichT = ichToken;
    if (allowNegative && script[ichToken] == '-') { ++ichT; }
    int ichBeginDigits = ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
    }
    if (ichBeginDigits == ichT) { return false; }
    cchToken = ichT - ichToken;
    return isInteger(script.substr(ichToken, cchToken).c_str());
  }